

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O3

double testExtendedKalmanFilter(void)

{
  long lVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scalar SVar7;
  double dVar8;
  double dVar9;
  DenseStorage<double,__1,__1,_1,_0> *this;
  LhsNested pMVar10;
  variable_if_dynamic<long,__1> vVar11;
  undefined8 __ptr;
  undefined8 uVar12;
  LhsNested pMVar13;
  DenseStorage<double,__1,__1,__1,_0> *pDVar14;
  int iVar15;
  DenseStorage<double,__1,__1,__1,_0> *pDVar16;
  undefined8 *puVar17;
  void *pvVar18;
  double *pdVar19;
  Index IVar20;
  DenseStorage<double,__1,__1,__1,_0> *pDVar21;
  Index index;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  Index dstRows;
  ActualDstType actualDst;
  undefined1 *puVar27;
  Index index_1;
  undefined4 uVar28;
  undefined4 uVar29;
  StateVector x;
  Pmatrix p;
  Qmatrix q;
  StateVector xh;
  StateVector error;
  Rmatrix r;
  Cmatrix c;
  StateVector dx;
  Qmatrix q1;
  Rmatrix r1;
  InputVector uk [1001];
  StateVector xk [1001];
  MeasureVector yk [1000];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_bd98;
  scalar_sum_op<double,_double> local_bd69;
  DenseStorage<double,__1,__1,__1,_0> local_bd68;
  double local_bd50;
  void *local_bd48;
  DenseStorage<double,__1,__1,__1,_0> *local_bd40;
  undefined1 local_bd30 [16];
  DenseStorage<double,__1,__1,__1,_0> *local_bd20;
  long lStack_bd18;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_bd10;
  Matrix<double,__1,__1,_0,__1,__1> local_bcf8;
  StateVector local_bce0;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcd0;
  DenseStorage<double,__1,__1,__1,_0> *local_bcc8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcc0;
  void *local_bcb8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcb0;
  DenseStorage<double,__1,__1,__1,_0> *local_bca8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bca0;
  Matrix<double,__1,__1,_0,__1,__1> local_bc98;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bc80;
  DenseStorage<double,__1,__1,__1,_0> *local_bc78;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bc70;
  void *local_bc68 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_bc58;
  Matrix<double,__1,_1,_0,__1,_1> local_bc48;
  DenseStorage<double,__1,__1,__1,_0> local_bc38;
  DenseStorage<double,__1,__1,__1,_0> local_bc20;
  DenseStorage<double,__1,__1,__1,_0> local_bc08;
  DenseStorage<double,__1,__1,__1,_0> local_bbf0;
  double *local_bbd8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bbd0;
  undefined1 local_bbc8 [15984];
  double *apdStack_7d58 [2];
  DenseStorage<double,__1,__1,_1,_0> local_7d48 [1000];
  DenseStorage<double,__1,__1,__1,_0> local_3ec8;
  long local_3eb0;
  DenseStorage<double,__1,__1,_1,_0> aDStack_3ea8 [999];
  
  if ((testExtendedKalmanFilter()::f == '\0') &&
     (iVar15 = __cxa_guard_acquire(&testExtendedKalmanFilter()::f), iVar15 != 0)) {
    stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
              ((ExtendedKalmanFilter *)testExtendedKalmanFilter()::f,4,3,1,true,true);
    __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                 testExtendedKalmanFilter()::f,&__dso_handle);
    __cxa_guard_release(&testExtendedKalmanFilter()::f);
  }
  memset(local_7d48,0,0x3e90);
  memset(&local_3ec8.m_cols,0,16000);
  memset(&local_bbd8,0,0x3e90);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (local_bd98.m_rhs.m_cols.m_value | local_bd98.m_rhs.m_rows.m_value)) {
    local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_bd98.m_rhs.m_rows.m_value;
    pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
    local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x3f847ae147ae147b;
    local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)&local_bd98;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc20,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_bce0);
    free(local_bd98.m_lhs);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (local_bd98.m_rhs.m_cols.m_value | local_bd98.m_rhs.m_rows.m_value)) {
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           local_bd98.m_rhs.m_rows.m_value;
      pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
      local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x3f847ae147ae147b;
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&local_bd98;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc38,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_bce0);
      free(local_bd98.m_lhs);
      stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
                ((DynamicalSystemFunctorBase *)&local_bce0);
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&PTR__KalmanFunctor_0011dbe8;
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
      ;
      pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bcc0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bcb8 = (void *)0x0;
      pDStack_bcb0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bca8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bca0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      pDStack_bc80 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bc78 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bc70 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      stateObservation::ObserverBase::stateVectorRandom();
      vVar11.m_value = local_bd98.m_rhs.m_rows.m_value;
      pMVar10 = local_bd98.m_lhs;
      if (-1 < local_bd98.m_rhs.m_rows.m_value) {
        if (pDStack_bcd0 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value)
        {
          free((void *)local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
          if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value ==
              (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
            pDVar16 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
          }
          else {
            if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar11.m_value) {
LAB_0010389f:
              puVar17 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar17 = operator_delete;
              __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pDVar16 = (DenseStorage<double,__1,__1,__1,_0> *)malloc(vVar11.m_value * 8);
            if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value !=
                (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pDVar16 & 0xf) != 0)
            goto LAB_001045af;
            if (pDVar16 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_0010389f;
          }
          pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value;
          local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = (Index)pDVar16;
        }
        uVar22 = vVar11.m_value & 0x7ffffffffffffffe;
        if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < (ulong)vVar11.m_value) {
          uVar23 = 0;
          do {
            ppdVar2 = (double **)
                      ((long)&pMVar10->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                      uVar23 * 8);
            dVar9 = (double)ppdVar2[1];
            ((double **)
            local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows)[uVar23] = (double *)((double)*ppdVar2 * 0.1);
            ((double **)
             local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows + uVar23)[1] = (double *)(dVar9 * 0.1);
            uVar23 = uVar23 + 2;
          } while (uVar23 < uVar22);
        }
        if ((long)uVar22 < vVar11.m_value) {
          do {
            ((double **)
            local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows)[uVar22] =
                 (double *)
                 ((double)*(double **)
                           ((long)&pMVar10->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           + uVar22 * 8) * 0.1);
            uVar22 = uVar22 + 1;
          } while (vVar11.m_value != uVar22);
        }
        free(local_bd98.m_lhs);
        stateObservation::ObserverBase::measureVectorRandom();
        vVar11.m_value = local_bd98.m_rhs.m_rows.m_value;
        pMVar10 = local_bd98.m_lhs;
        if (-1 < local_bd98.m_rhs.m_rows.m_value) {
          if (pDStack_bcb0 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value
             ) {
            free(local_bcb8);
            if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value ==
                (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
              pvVar18 = (void *)0x0;
            }
            else {
              if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar11.m_value)
              {
LAB_001039c4:
                puVar17 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar17 = operator_delete;
                __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              pvVar18 = malloc(vVar11.m_value * 8);
              if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value !=
                  (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pvVar18 & 0xf) != 0)
              goto LAB_001045af;
              if (pvVar18 == (void *)0x0) goto LAB_001039c4;
            }
            pDStack_bcb0 = (DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value;
            local_bcb8 = pvVar18;
          }
          uVar22 = vVar11.m_value & 0x7ffffffffffffffe;
          if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < (ulong)vVar11.m_value) {
            uVar23 = 0;
            do {
              ppdVar2 = (double **)
                        ((long)&pMVar10->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                        uVar23 * 8);
              dVar9 = (double)ppdVar2[1];
              pdVar19 = (double *)((long)local_bcb8 + uVar23 * 8);
              *pdVar19 = (double)*ppdVar2 * 0.1;
              pdVar19[1] = dVar9 * 0.1;
              uVar23 = uVar23 + 2;
            } while (uVar23 < uVar22);
          }
          if ((long)uVar22 < vVar11.m_value) {
            do {
              *(double *)((long)local_bcb8 + uVar22 * 8) =
                   (double)*(double **)
                            ((long)&pMVar10->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            + uVar22 * 8) * 0.1;
              uVar22 = uVar22 + 1;
            } while (vVar11.m_value != uVar22);
          }
          free(local_bd98.m_lhs);
          stateObservation::ObserverBase::stateVectorRandom();
          pDVar21 = pDStack_bcc0;
          pDVar16 = local_bcc8;
          local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          pDStack_bcc0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          local_bd98.m_lhs = (LhsNested)pDVar16;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar21;
          free(pDVar16);
          stateObservation::ObserverBase::measureVectorRandom();
          pDVar21 = pDStack_bca0;
          pDVar16 = local_bca8;
          local_bca8 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          pDStack_bca0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          local_bd98.m_lhs = (LhsNested)pDVar16;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar21;
          free(pDVar16);
          stateObservation::KalmanFilterBase::getAmatrixRandom();
          if ((local_bd68.m_cols | local_bd68.m_rows) < 0) goto LAB_001045ce;
          local_bd98.m_rhs.m_rows.m_value = local_bd68.m_rows;
          local_bd98.m_rhs.m_cols.m_value = local_bd68.m_cols;
          local_bd98.m_rhs.m_functor.m_other = 0.6;
          local_bd98.m_lhs = (LhsNested)&local_bd68;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_bc98,&local_bd98,(assign_op<double,_double> *)&local_bd10);
          free(local_bd68.m_data);
          stateObservation::KalmanFilterBase::getCmatrixRandom();
          pDVar14 = pDStack_bc70;
          pDVar21 = local_bc78;
          pDVar16 = pDStack_bc80;
          pDStack_bc80 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          local_bd98.m_lhs = (LhsNested)pDVar16;
          local_bc78 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          pDStack_bc70 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar21;
          local_bd98.m_rhs.m_cols.m_value = (long)pDVar14;
          free(pDVar16);
          stateObservation::ObserverBase::stateVectorZero();
          vVar11.m_value = local_bd98.m_rhs.m_rows.m_value;
          pMVar10 = local_bd98.m_lhs;
          if (local_7d48[0].m_rows != local_bd98.m_rhs.m_rows.m_value) {
            if (local_bd98.m_rhs.m_rows.m_value < 0) {
LAB_001044ee:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            free(local_7d48[0].m_data);
            if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value ==
                (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
              pdVar19 = (double *)0x0;
            }
            else {
              if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar11.m_value)
              {
LAB_00103c0a:
                puVar17 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar17 = operator_delete;
                __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              pdVar19 = (double *)malloc(vVar11.m_value * 8);
              if ((DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value !=
                  (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pdVar19 & 0xf) != 0) {
LAB_001045af:
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pdVar19 == (double *)0x0) goto LAB_00103c0a;
            }
            local_7d48[0].m_rows = vVar11.m_value;
            local_7d48[0].m_data = pdVar19;
          }
          uVar22 = vVar11.m_value - (vVar11.m_value >> 0x3f) & 0xfffffffffffffffe;
          if (1 < vVar11.m_value) {
            lVar25 = 0;
            do {
              ppdVar2 = (double **)
                        ((long)&pMVar10->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                        lVar25 * 8);
              dVar9 = (double)ppdVar2[1];
              local_7d48[0].m_data[lVar25] = (double)*ppdVar2;
              (local_7d48[0].m_data + lVar25)[1] = dVar9;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar22);
          }
          if ((long)uVar22 < vVar11.m_value) {
            do {
              local_7d48[0].m_data[uVar22] =
                   (double)*(double **)
                            ((long)&pMVar10->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            + uVar22 * 8);
              uVar22 = uVar22 + 1;
            } while (vVar11.m_value != uVar22);
          }
          stateObservation::ObserverBase::inputVectorRandom();
          pDVar16 = pDStack_bbd0;
          pdVar19 = local_bbd8;
          local_bbd8 = local_bd68.m_data;
          pDStack_bbd0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd68.m_rows;
          local_bd68.m_data = pdVar19;
          local_bd68.m_rows = (Index)pDVar16;
          free(pdVar19);
          lVar25 = 1;
          do {
            stateObservation::ObserverBase::inputVectorRandom();
            pdVar19 = (&local_bbd8)[lVar25 * 2];
            pDVar16 = *(DenseStorage<double,__1,__1,__1,_0> **)(local_bbc8 + lVar25 * 0x10 + -8);
            (&local_bbd8)[lVar25 * 2] = local_bd68.m_data;
            *(Index *)(local_bbc8 + lVar25 * 0x10 + -8) = local_bd68.m_rows;
            local_bd68.m_data = pdVar19;
            local_bd68.m_rows = (Index)pDVar16;
            free(pdVar19);
            stateObservation::ObserverBase::stateVectorZero();
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_bbf0,&local_bc38);
            IVar20 = stateObservation::ObserverBase::getStateSize();
            stateObservation::tools::ProbabilityLawSimulation::
            getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      ((ProbabilityLawSimulation *)&local_bd68,&local_bc48,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_bbf0,IVar20,1);
            free(local_bbf0.m_data);
            free(local_bc48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data);
            stateObservation::ObserverBase::measureVectorZero();
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_bc08,&local_bc20);
            IVar20 = stateObservation::ObserverBase::getMeasureSize();
            stateObservation::tools::ProbabilityLawSimulation::
            getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      ((ProbabilityLawSimulation *)&local_bd10,&local_bc58,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_bc08,IVar20,1);
            free(local_bc08.m_data);
            free(local_bc58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data);
            lVar1 = lVar25 + -1;
            local_bd50 = (double)lVar25;
            testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::
            Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                      (&local_bd48,&local_bce0,(InputVector *)&local_bd98,
                       (TimeIndex)(&local_bbd8 + lVar1 * 2));
            pDVar16 = local_bd40;
            pvVar18 = local_bd48;
            pdVar19 = local_bd68.m_data;
            if (local_bd40 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd68.m_rows) {
LAB_001044cf:
              pcVar24 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001044e4;
            }
            if ((DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value != local_bd40
               ) {
              if ((long)local_bd40 < 0) goto LAB_001044ee;
              free(local_bd98.m_lhs);
              if (pDVar16 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
                pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
              }
              else {
                if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < pDVar16) {
LAB_0010454b:
                  puVar17 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar17 = operator_delete;
                  __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)malloc((long)pDVar16 * 8);
                if (pDVar16 != (DenseStorage<double,__1,__1,__1,_0> *)0x1 &&
                    ((ulong)pDVar21 & 0xf) != 0) goto LAB_001045af;
                if (pDVar21 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_0010454b;
              }
              local_bd98.m_rhs.m_rows.m_value = (long)pDVar16;
              local_bd98.m_lhs = (LhsNested)pDVar21;
            }
            dVar9 = local_bd50;
            vVar11.m_value = local_bd98.m_rhs.m_rows.m_value;
            pMVar10 = local_bd98.m_lhs;
            uVar22 = (long)pDVar16 - ((long)pDVar16 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)pDVar16) {
              lVar26 = 0;
              do {
                pdVar3 = (double *)((long)pvVar18 + lVar26 * 8);
                pdVar4 = pdVar19 + lVar26;
                dVar8 = pdVar3[1] + pdVar4[1];
                auVar5._8_4_ = SUB84(dVar8,0);
                auVar5._0_8_ = *pdVar3 + *pdVar4;
                auVar5._12_4_ = (int)((ulong)dVar8 >> 0x20);
                *(undefined1 (*) [16])
                 ((long)&(local_bd98.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                 lVar26 * 8) = auVar5;
                lVar26 = lVar26 + 2;
              } while (lVar26 < (long)uVar22);
            }
            if ((long)uVar22 < (long)pDVar16) {
              do {
                *(double **)
                 ((long)&(local_bd98.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                 uVar22 * 8) = (double *)(*(double *)((long)pvVar18 + uVar22 * 8) + pdVar19[uVar22])
                ;
                uVar22 = uVar22 + 1;
              } while (pDVar16 != (DenseStorage<double,__1,__1,__1,_0> *)uVar22);
            }
            if ((DenseStorage<double,__1,__1,__1,_0> *)local_7d48[lVar25].m_rows !=
                (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value) {
              if (local_bd98.m_rhs.m_rows.m_value < 0) goto LAB_001044ee;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        (local_7d48 + lVar25,local_bd98.m_rhs.m_rows.m_value,
                         local_bd98.m_rhs.m_rows.m_value,1);
              if ((DenseStorage<double,__1,__1,__1,_0> *)local_7d48[lVar25].m_rows !=
                  (DenseStorage<double,__1,__1,__1,_0> *)vVar11.m_value) {
                pcVar24 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                ;
                goto LAB_001045a5;
              }
            }
            pdVar19 = local_7d48[lVar25].m_data;
            uVar22 = vVar11.m_value - (vVar11.m_value >> 0x3f) & 0xfffffffffffffffe;
            if (1 < vVar11.m_value) {
              lVar26 = 0;
              do {
                ppdVar2 = (double **)
                          ((long)&pMVar10->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                          lVar26 * 8);
                dVar8 = (double)ppdVar2[1];
                pdVar3 = pdVar19 + lVar26;
                *pdVar3 = (double)*ppdVar2;
                pdVar3[1] = dVar8;
                lVar26 = lVar26 + 2;
              } while (lVar26 < (long)uVar22);
            }
            if ((long)uVar22 < vVar11.m_value) {
              do {
                pdVar19[uVar22] =
                     (double)*(double **)
                              ((long)&pMVar10->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              + uVar22 * 8);
                uVar22 = uVar22 + 1;
              } while (vVar11.m_value != uVar22);
            }
            free(local_bd48);
            testExtendedKalmanFilter()::KalmanFunctor::measureDynamics(Eigen::
            Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                      (&local_bd48,&local_bce0,(InputVector *)&local_bd98,uVar22);
            pMVar13 = local_bd10.m_lhs;
            pDVar16 = local_bd40;
            pvVar18 = local_bd48;
            if (local_bd40 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd10.m_rhs.m_matrix)
            goto LAB_001044cf;
            this = (DenseStorage<double,__1,__1,_1,_0> *)((long)aDStack_3ea8 + (lVar25 + -2) * 0x10)
            ;
            if ((DenseStorage<double,__1,__1,__1,_0> *)(&local_3eb0)[lVar1 * 2] != local_bd40) {
              if ((long)local_bd40 < 0) goto LAB_001044ee;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        (this,(Index)local_bd40,(Index)local_bd40,1);
              if ((DenseStorage<double,__1,__1,__1,_0> *)(&local_3eb0)[lVar1 * 2] != pDVar16) {
                pcVar24 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                ;
LAB_001045a5:
                __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                              "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar24);
              }
            }
            pdVar19 = this->m_data;
            uVar22 = (long)pDVar16 - ((long)pDVar16 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)pDVar16) {
              lVar25 = 0;
              do {
                pdVar3 = (double *)((long)pvVar18 + lVar25 * 8);
                ppdVar2 = (double **)
                          ((long)&pMVar13->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                          lVar25 * 8);
                dVar8 = pdVar3[1] + (double)ppdVar2[1];
                auVar6._8_4_ = SUB84(dVar8,0);
                auVar6._0_8_ = *pdVar3 + (double)*ppdVar2;
                auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
                *(undefined1 (*) [16])(pdVar19 + lVar25) = auVar6;
                lVar25 = lVar25 + 2;
              } while (lVar25 < (long)uVar22);
            }
            if ((long)uVar22 < (long)pDVar16) {
              do {
                pdVar19[uVar22] =
                     *(double *)((long)pvVar18 + uVar22 * 8) +
                     (double)*(double **)
                              ((long)&pMVar13->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              + uVar22 * 8);
                uVar22 = uVar22 + 1;
              } while (pDVar16 != (DenseStorage<double,__1,__1,__1,_0> *)uVar22);
            }
            free(local_bd48);
            free(local_bd10.m_lhs);
            free(local_bd68.m_data);
            lVar25 = (long)dVar9 + 1;
          } while (lVar25 != 0x3e9);
          free(local_bd98.m_lhs);
          stateObservation::ExtendedKalmanFilter::setFunctor
                    ((DynamicalSystemFunctorBase *)testExtendedKalmanFilter()::f);
          stateObservation::ObserverBase::stateVectorRandom();
          stateObservation::ZeroDelayObserver::setState
                    ((Matrix *)testExtendedKalmanFilter()::f,(long)local_7d48);
          stateObservation::KalmanFilterBase::getPmatrixZero();
          for (uVar22 = 0; lVar25 = stateObservation::ObserverBase::getStateSize(),
              (long)uVar22 < lVar25; uVar22 = (ulong)((int)uVar22 + 1)) {
            if ((long)local_bd30._8_8_ <= (long)uVar22) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            if ((local_bd68.m_rows <= (long)uVar22) || (local_bd68.m_cols <= (long)uVar22)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                           );
            }
            local_bd68.m_data[local_bd68.m_rows * uVar22 + uVar22] =
                 (double)((double **)local_bd30._0_8_)[uVar22];
          }
          local_bd10.m_lhs = (LhsNested)&local_bd68;
          local_bd10.m_rhs.m_matrix = (non_const_type)&local_bd68;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd98,&local_bd10);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_bd68,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&local_bd98,
                     (assign_op<double,_double> *)&local_bd48);
          free(local_bd98.m_lhs);
          stateObservation::KalmanFilterBase::setStateCovariance
                    ((Matrix *)testExtendedKalmanFilter()::f);
          local_bd98.m_lhs = (LhsNested)&local_bc20;
          local_bd98.m_rhs.m_rows.m_value = (long)local_bd98.m_lhs;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd10,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                      *)&local_bd98);
          local_bd98.m_lhs = (LhsNested)&local_bc38;
          local_bd98.m_rhs.m_rows.m_value = (long)local_bd98.m_lhs;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd48,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                      *)&local_bd98);
          stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilter()::f);
          stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilter()::f);
          stateObservation::ZeroDelayObserver::setInput
                    ((Matrix *)testExtendedKalmanFilter()::f,(long)&local_bbd8);
          stateObservation::ObserverBase::stateVectorConstant(1.0);
          if (-1 < local_bcf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows) {
            local_bd98.m_rhs.m_rows.m_value =
                 local_bcf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_bd98.m_rhs.m_functor.m_other = 1e-08;
            local_bd98.m_lhs = &local_bcf8;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_bc68,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)&local_bd98);
            free(local_bcf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            lVar25 = 1;
            puVar27 = local_bbc8;
            pDVar16 = &local_3ec8;
            do {
              pDVar16 = (DenseStorage<double,__1,__1,__1,_0> *)&pDVar16->m_cols;
              stateObservation::ZeroDelayObserver::setMeasurement
                        ((Matrix *)testExtendedKalmanFilter()::f,(long)pDVar16);
              stateObservation::ZeroDelayObserver::setInput
                        ((Matrix *)testExtendedKalmanFilter()::f,(long)puVar27);
              stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_bd98);
              stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_bcf8);
              stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilter()::f);
              stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilter()::f);
              stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_bd20);
              uVar12 = local_bd30._8_8_;
              __ptr = local_bd30._0_8_;
              local_bd30._0_8_ = local_bd20;
              local_bd30._8_8_ = lStack_bd18;
              local_bd20 = (DenseStorage<double,__1,__1,__1,_0> *)__ptr;
              lStack_bd18 = uVar12;
              free((void *)__ptr);
              free(local_bcf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_bd98.m_lhs);
              lVar25 = lVar25 + 1;
              puVar27 = puVar27 + 0x10;
            } while (lVar25 != 0x3e9);
            local_bd98.m_rhs.m_rows.m_value = (long)&local_3ec8;
            local_bd98.m_lhs = (LhsNested)local_bd30;
            if (local_bd30._8_8_ == local_3ec8.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_bd20,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_bd98);
              local_bcf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_bd20;
              if (lStack_bd18 == 0) {
                uVar28 = 0;
                uVar29 = 0;
              }
              else {
                if (lStack_bd18 < 1) {
                  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                               );
                }
                local_bd98.m_rhs.m_rows.m_value = (long)local_bd20;
                SVar7 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&local_bd98,&local_bd69,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                    *)&local_bcf8);
                uVar28 = SUB84(SVar7,0);
                uVar29 = (undefined4)((ulong)SVar7 >> 0x20);
              }
              local_bd50 = (double)CONCAT44(uVar29,uVar28);
              free(local_bd20);
              free(local_bc68[0]);
              free(local_bd48);
              free(local_bd10.m_lhs);
              free(local_bd68.m_data);
              free((void *)local_bd30._0_8_);
              local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (double *)&PTR__KalmanFunctor_0011dbe8;
              free(pDStack_bc80);
              free(local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_bca8);
              free(local_bcb8);
              free(local_bcc8);
              free((void *)local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           .m_storage.m_rows);
              stateObservation::DynamicalSystemFunctorBase::~DynamicalSystemFunctorBase
                        ((DynamicalSystemFunctorBase *)&local_bce0);
              free(local_bc38.m_data);
              free(local_bc20.m_data);
              lVar25 = 0x3e90;
              do {
                free(*(void **)((long)&local_bbf0.m_rows + lVar25));
                lVar25 = lVar25 + -0x10;
              } while (lVar25 != 0);
              lVar25 = 16000;
              do {
                free(*(void **)((long)&local_3ec8.m_data + lVar25));
                lVar25 = lVar25 + -0x10;
              } while (lVar25 != 0);
              lVar25 = 0x3e90;
              do {
                free(*(void **)((long)apdStack_7d58 + lVar25));
                lVar25 = lVar25 + -0x10;
              } while (lVar25 != 0);
              return SQRT(local_bd50);
            }
            pcVar24 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
LAB_001044e4:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar24);
          }
        }
      }
      pcVar24 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001045fa;
    }
  }
LAB_001045ce:
  pcVar24 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
  ;
LAB_001045fa:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar24);
}

Assistant:

double testExtendedKalmanFilter()
{
  /// the number of samples
  const static stateObservation::Index kmax = 1000;

  /// define the type of the extended Kalman filter
  typedef stateObservation::ExtendedKalmanFilter ekf;

  /// instanciation of the extended Kalman filter
  static ekf f(4, 3, 1);

  /// The functor that describes the dynamics of the state
  /// and the measurement
  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    /// Constructor
    KalmanFunctor()
    {
      s_ = f.stateVectorRandom() * 0.1;
      m_ = f.measureVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
      a_ = f.getAmatrixRandom() * 0.6;
      c_ = f.getCmatrixRandom();
    }

    /// The dynamics of the state xk1=f(xk,u,k)
    virtual ekf::StateVector stateDynamics(const ekf::StateVector & xk,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;

      xk1 = a_ * xk + cos(10 * (xk.transpose() * xk)[0]) * s_ + t_ + (u.transpose() * u)(0, 0) * s_;
      return xk1;
    }

    /// The dynamics of the state yk=h(xk,u,k)
    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & xk,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * xk + cos(10 * (xk.transpose() * xk)[0]) * m_ + n_;
      return yk;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    /// containers for the vectors and matrices
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  /// containers for the state, the measurements and the input
  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector uk[kmax + 1];

  /// the standard deviation matrix to generate the gaussian noise
  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;
  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  /// instanciate the functor
  KalmanFunctor func;

  { /// Construction of the sequence of states measurements and inputs

    /// initializations
    ekf::StateVector x = f.stateVectorZero();
    xk[0] = x;
    uk[0] = f.inputVectorRandom();

    for(stateObservation::Index k = 1; k <= kmax; ++k)
    {
      /// generation of random inputs
      uk[k] = f.inputVectorRandom();

      /// generation of Gaussian white noises
      ekf::StateVector v = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(f.stateVectorZero(), q1,
                                                                                                f.getStateSize(), 1);

      ekf::MeasureVector w = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(
          f.measureVectorZero(), r1, f.getMeasureSize());

      /// the dynamics is executed here
      xk[k] = x = func.stateDynamics(x, uk[k - 1], k - 1) + v;
      yk[k - 1] = func.measureDynamics(x, uk[k], k) + w;
    }
  }

  /// set the functor of the extended Kalman filter
  f.setFunctor(&func);

  /// generation of a random initial estimation of the state
  ekf::StateVector xh = f.stateVectorRandom();

  /// set the initial state of the estimator
  f.setState(xk[0], 0);

  /// set the covariance matrix of the initial estimation error
  ekf::Pmatrix p = f.getPmatrixZero();
  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();
  f.setStateCovariance(p);

  /// the covariance matrices for the process noise and the measurements noise
  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  /// set the covariance matrices for the extended Kalman filter
  f.setR(r);
  f.setQ(q);

  /// set initial input
  f.setInput(uk[0], 0);

  /// set the derivation step for the finite difference method
  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    /// give the measurements and the inputs at instant i to the ekf
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);

    /// obtain jacobians by finite differences method
    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    /// set the jacobians to the ekf
    f.setA(a);
    f.setC(c);

    /// get the estimation of the state at instant i;
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}